

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O0

bool __thiscall CExtPubKey::Derive(CExtPubKey *this,CExtPubKey *out,uint _nChild)

{
  uchar uVar1;
  uchar uVar2;
  bool bVar3;
  undefined4 in_EDX;
  long in_RSI;
  ChainCode *in_RDI;
  long in_FS_OFFSET;
  CKeyID id;
  ChainCode *cc;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  ChainCode *in_stack_ffffffffffffffe8;
  CPubKey *in_stack_fffffffffffffff0;
  CPubKey *this_00;
  
  this_00 = *(CPubKey **)(in_FS_OFFSET + 0x28);
  uVar1 = (in_RDI->super_base_blob<256U>).m_data._M_elems[4];
  cc = in_RDI;
  uVar2 = std::numeric_limits<unsigned_char>::max();
  if (uVar1 == uVar2) {
    bVar3 = false;
  }
  else {
    *(uchar *)(in_RSI + 4) = (in_RDI->super_base_blob<256U>).m_data._M_elems[4] + '\x01';
    CPubKey::GetID((CPubKey *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    *(uint *)(in_RSI + 5) = in_stack_ffffffffffffffe4;
    *(undefined4 *)(in_RSI + 0xc) = in_EDX;
    bVar3 = CPubKey::Derive(this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                            in_stack_ffffffffffffffe4,cc);
  }
  if (*(CPubKey **)(in_FS_OFFSET + 0x28) == this_00) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CExtPubKey::Derive(CExtPubKey &out, unsigned int _nChild) const {
    if (nDepth == std::numeric_limits<unsigned char>::max()) return false;
    out.nDepth = nDepth + 1;
    CKeyID id = pubkey.GetID();
    memcpy(out.vchFingerprint, &id, 4);
    out.nChild = _nChild;
    return pubkey.Derive(out.pubkey, out.chaincode, _nChild, chaincode);
}